

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O2

void __thiscall Simulation::run(Simulation *this)

{
  Renderer *this_00;
  Fluids *this_01;
  bool bVar1;
  long lVar2;
  Field<double,_unsigned_short> *F;
  long lVar3;
  Simulation *this_02;
  ulong iteration;
  
  iteration = 0;
  printStatus(this,0,0.0);
  this_01 = &this->_fluid;
  this_00 = &this->_renderer;
  while( true ) {
    bVar1 = Window::windowShouldClose(&this->_window);
    if ((bVar1) || (Config::endFrame <= iteration)) break;
    lVar2 = std::chrono::_V2::system_clock::now();
    this_02 = (Simulation *)this_01;
    Fluids::update(this_01,iteration);
    if (Config::renderFrames == '\x01') {
      this_02 = this;
      renderFrame(this);
    }
    if (Config::dim == 3) {
      if (Config::exportFrames == '\x01') {
        Renderer::writeImg(this_00,(uint32_t)iteration);
      }
      F = Fluids::surface(this_01);
      this_02 = (Simulation *)&this->field_0x68;
      MarchingCube::run((MarchingCube *)&this->field_0x68,F,iteration);
    }
    else if (Config::dim == 2) {
      this_02 = (Simulation *)this_00;
      Renderer::writeImg(this_00,(uint32_t)iteration);
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    printStatus(this_02,iteration,(float)(lVar3 - lVar2) / 1e+09);
    iteration = iteration + 1;
  }
  Renderer::freeMesh(this_00,&(this->_fluidRenderer).mesh);
  Renderer::freeMesh(this_00,&(this->_fluidRenderer).meshGrid);
  Renderer::freeMesh(this_00,&(this->_fluidRenderer).meshGridBorder);
  Renderer::freeMesh(this_00,&(this->_fluidRenderer).meshVec);
  return;
}

Assistant:

void Simulation::run()
{
    float dt = 0.0f;
    std::uint64_t it = 0;
    printStatus(it, dt);
    while (!_window.windowShouldClose() && it < Config::endFrame)
    {
        auto startTime = std::chrono::high_resolution_clock::now();

        // Simulation update in the step-time
        stepFluid(it);

        // Simulation rendering
        if (Config::renderFrames)
        {
            renderFrame();
        }

        // Simulation results export
        // in either .png or .ply depending on the grid dimension
        switch (Config::dim)
        {
            case 2:
                _renderer.writeImg(it);
                break;
            case 3:
                if (Config::exportFrames)
                {
                    _renderer.writeImg(it);
                }
                marchingCube.run(_fluid.surface(), it);
                break;
        }

        auto stopTime = std::chrono::high_resolution_clock::now();
        dt = std::chrono::duration<float, std::chrono::seconds::period>(
                stopTime - startTime).count();
        printStatus(it, dt);

        it++;
    }

    // Clean meshes
    _renderer.freeMesh(_fluidRenderer.mesh);
    _renderer.freeMesh(_fluidRenderer.meshGrid);
    _renderer.freeMesh(_fluidRenderer.meshGridBorder);
    _renderer.freeMesh(_fluidRenderer.meshVec);
}